

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::Matcher<unsigned_long>::Matcher(Matcher<unsigned_long> *this,unsigned_long value)

{
  Matcher<unsigned_long> *in_RDI;
  Matcher<unsigned_long> *in_stack_ffffffffffffffa8;
  EqMatcher<unsigned_long> *in_stack_ffffffffffffffd8;
  
  internal::MatcherBase<unsigned_long>::MatcherBase((MatcherBase<unsigned_long> *)0x18c09d);
  (in_RDI->super_MatcherBase<unsigned_long>)._vptr_MatcherBase =
       (_func_int **)&PTR__Matcher_003d3ef8;
  Eq<unsigned_long>((unsigned_long)in_stack_ffffffffffffffa8);
  internal::EqMatcher::operator_cast_to_Matcher(in_stack_ffffffffffffffd8);
  operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~Matcher((Matcher<unsigned_long> *)0x18c0f3);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }